

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O1

void rcg::storePointCloud
               (string *name,double f,double t,double scale,shared_ptr<const_rcg::Image> *left,
               shared_ptr<const_rcg::Image> *disp,shared_ptr<const_rcg::Image> *conf,
               shared_ptr<const_rcg::Image> *error)

{
  element_type *peVar1;
  uint64_t uVar2;
  undefined1 *puVar3;
  undefined8 this;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  short sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  short sVar12;
  uchar *puVar13;
  uchar *puVar14;
  long lVar15;
  long lVar16;
  pointer puVar17;
  ushort uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  size_t i;
  long lVar22;
  _Head_base<0UL,_unsigned_char_*,_false> _Var23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 uVar32;
  undefined1 auVar31 [16];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  short sVar42;
  short sVar43;
  ushort uVar54;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar44;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  uint8_t rgb [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vindex;
  ofstream out;
  char local_35a;
  char local_359;
  _Head_base<0UL,_unsigned_char_*,_false> local_358;
  _Head_base<0UL,_unsigned_char_*,_false> local_350;
  _Head_base<0UL,_unsigned_char_*,_false> local_348;
  uchar *local_340;
  pointer local_338;
  ulong local_330;
  long local_328;
  double local_320;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> local_318;
  uint local_30c;
  pointer local_308;
  double dStack_300;
  double local_2f0;
  string local_2e8;
  byte bStack_2e7;
  byte bStack_2e6;
  undefined1 uStack_2e5;
  undefined4 uStack_2e4;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  long local_2b8;
  long local_2b0;
  shared_ptr<const_rcg::Image> *local_2a8;
  shared_ptr<const_rcg::Image> *local_2a0;
  double local_298;
  ulong local_290;
  long local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_280;
  long local_268;
  filebuf local_260 [104];
  ios_base local_1f8 [136];
  ios_base local_170 [264];
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  
  local_2c8._8_8_ = local_2c8._0_8_;
  peVar1 = (disp->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var23._M_head_impl =
       *(uchar **)
        &(peVar1->pixel)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
  local_330 = peVar1->width;
  puVar14 = (uchar *)peVar1->height;
  local_359 = peVar1->bigendian;
  local_290 = ((((left->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                width + local_330) - 1) / local_330;
  local_328 = local_330 * 2 + peVar1->xpadding;
  uVar21 = 0;
  local_350._M_head_impl = (uchar *)error;
  local_348._M_head_impl = (uchar *)conf;
  local_338 = (pointer)scale;
  local_320 = t;
  local_2f0 = f;
  local_2a8 = left;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_280,(long)puVar14 * local_330,(allocator_type *)&local_268);
  if (puVar14 != (uchar *)0x0) {
    lVar9 = 0;
    puVar13 = (uchar *)0x0;
    do {
      lVar15 = 0;
      do {
        local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9 + lVar15] = 0xffffffff;
        if (*(char *)((long)_Var23._M_head_impl + lVar15 * 2 + 1) != '\0' ||
            *(char *)((long)_Var23._M_head_impl + lVar15 * 2) != '\0') {
          local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9 + lVar15] = uVar21;
          uVar21 = uVar21 + 1;
        }
        lVar15 = lVar15 + 1;
      } while (local_330 + (local_330 == 0) != lVar15);
      _Var23._M_head_impl = _Var23._M_head_impl + local_328;
      puVar13 = puVar13 + 1;
      lVar9 = lVar9 + lVar15;
    } while (puVar13 != puVar14);
  }
  local_2c8._0_8_ = name;
  local_318.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (((disp->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->pixel).
       _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>;
  local_340 = puVar14;
  local_2a0 = disp;
  dVar25 = ceil(2.0 / (double)local_338);
  local_30c = (uint)dVar25;
  local_358._M_head_impl = (uchar *)0x0;
  if ((uchar *)0x1 < local_340) {
    local_308 = (pointer)(local_330 - 1);
    local_358._M_head_impl = (uchar *)0x0;
    puVar14 = (uchar *)0x1;
    _Var23 = local_318.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    do {
      if (1 < local_330) {
        lVar9 = 0;
        puVar17 = local_308;
        do {
          bVar24 = local_359 != '\0';
          lVar15 = lVar9;
          if (bVar24) {
            lVar15 = lVar9 + 1;
          }
          lVar11 = lVar9 + 3;
          lVar6 = lVar9 + 1;
          if (bVar24) {
            lVar6 = lVar9;
          }
          lVar9 = lVar9 + 2;
          lVar22 = lVar9;
          if (bVar24) {
            lVar22 = lVar11;
          }
          if (bVar24) {
            lVar11 = lVar9;
          }
          sVar43 = CONCAT11(_Var23._M_head_impl[lVar6],_Var23._M_head_impl[lVar15]);
          sVar12 = CONCAT11(_Var23._M_head_impl[lVar11],_Var23._M_head_impl[lVar22]);
          sVar8 = CONCAT11(_Var23._M_head_impl[lVar6 + local_328],
                           _Var23._M_head_impl[lVar15 + local_328]);
          uVar18 = (ushort)_Var23._M_head_impl[lVar22 + local_328] |
                   (ushort)((uint)_Var23._M_head_impl[lVar11 + local_328] << 8);
          uVar19 = CONCAT26(uVar18,CONCAT24(sVar8,CONCAT22(sVar12,sVar43)));
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar19;
          auVar57._0_2_ = -(ushort)(sVar43 == 0);
          auVar57._2_2_ = -(ushort)(sVar43 == 0);
          auVar57._4_2_ = -(ushort)(sVar12 == 0);
          auVar57._6_2_ = -(ushort)(sVar12 == 0);
          auVar57._8_2_ = -(ushort)(sVar8 == 0);
          auVar57._10_2_ = -(ushort)(sVar8 == 0);
          auVar57._12_2_ = -(ushort)(uVar18 == 0);
          auVar57._14_2_ = -(ushort)(uVar18 == 0);
          uVar21 = movmskps((uint)_Var23._M_head_impl[lVar11 + local_328] << 8,auVar57);
          uVar21 = (uint)(0x4332322132212110 >> ((byte)((uVar21 ^ 0xf) << 2) & 0x3f)) & 7;
          if (2 < (byte)uVar21) {
            auVar47._0_2_ = -(ushort)(sVar43 == 0);
            auVar47._2_2_ = -(ushort)(sVar12 == 0);
            auVar47._4_2_ = -(ushort)(sVar8 == 0);
            auVar47._6_2_ = -(ushort)(uVar18 == 0);
            auVar47._8_2_ = 0xffff;
            auVar47._10_2_ = 0xffff;
            auVar47._12_2_ = 0xffff;
            auVar47._14_2_ = 0xffff;
            auVar47 = auVar47 | auVar50;
            uVar32 = auVar47._4_4_;
            auVar55._4_4_ = uVar32;
            auVar55._0_4_ = uVar32;
            auVar55._8_4_ = uVar32;
            auVar55._12_4_ = uVar32;
            auVar57 = psubusw(auVar47,auVar55);
            sVar42 = auVar47._0_2_ - auVar57._0_2_;
            uVar54 = auVar47._2_2_ - auVar57._2_2_;
            auVar45._0_8_ =
                 CONCAT26(auVar47._6_2_ - auVar57._6_2_,
                          CONCAT24(auVar47._4_2_ - auVar57._4_2_,CONCAT22(uVar54,sVar42)));
            auVar45._8_2_ = auVar47._8_2_ - auVar57._8_2_;
            auVar45._10_2_ = auVar47._10_2_ - auVar57._10_2_;
            auVar48._12_2_ = auVar47._12_2_ - auVar57._12_2_;
            auVar48._0_12_ = auVar45;
            auVar48._14_2_ = auVar47._14_2_ - auVar57._14_2_;
            auVar56._2_2_ = 0;
            auVar56._0_2_ = uVar54;
            auVar56._4_4_ = (uint)((ulong)auVar45._0_8_ >> 0x30);
            auVar56._8_4_ = auVar45._8_4_ >> 0x10;
            auVar56._12_4_ = auVar48._12_4_ >> 0x10;
            auVar57 = psubusw(auVar48,auVar56);
            uVar32 = (undefined4)(uVar19 >> 0x20);
            auVar49._4_4_ = uVar32;
            auVar49._0_4_ = uVar32;
            auVar49._8_4_ = uVar32;
            auVar49._12_4_ = uVar32;
            auVar50 = psubusw(auVar49,auVar50);
            sVar43 = auVar50._0_2_ + sVar43;
            uVar54 = auVar50._2_2_ + sVar12;
            auVar46._0_8_ =
                 CONCAT26(auVar50._6_2_ + uVar18,
                          CONCAT24(auVar50._4_2_ + sVar8,CONCAT22(uVar54,sVar43)));
            auVar46._8_2_ = auVar50._8_2_;
            auVar46._10_2_ = auVar50._10_2_;
            auVar51._12_2_ = auVar50._12_2_;
            auVar51._14_2_ = auVar50._14_2_;
            auVar51._0_12_ = auVar46;
            auVar35._2_2_ = 0;
            auVar35._0_2_ = uVar54;
            auVar35._4_4_ = (uint)((ulong)auVar46._0_8_ >> 0x30);
            auVar35._8_4_ = auVar46._8_4_ >> 0x10;
            auVar35._12_4_ = auVar51._12_4_ >> 0x10;
            auVar50 = psubusw(auVar35,auVar51);
            if ((int)((uint)(ushort)(auVar50._0_2_ + sVar43) -
                     (uint)(ushort)(sVar42 - auVar57._0_2_)) <= (int)(local_30c & 0xffff)) {
              local_358._M_head_impl = (uchar *)(ulong)(((int)local_358._M_head_impl + uVar21) - 2);
            }
          }
          puVar17 = (pointer)((long)puVar17 + -1);
        } while (puVar17 != (pointer)0x0);
      }
      _Var23._M_head_impl = _Var23._M_head_impl + local_328;
      puVar14 = puVar14 + 1;
    } while (puVar14 != local_340);
  }
  peVar1 = ((__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *)local_348._M_head_impl)->
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_348._M_head_impl = (uchar *)0x0;
    local_2b0 = 0;
  }
  else {
    local_348._M_head_impl =
         *(uchar **)
          &(peVar1->pixel)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
    local_2b0 = peVar1->xpadding + peVar1->width;
  }
  this = local_2c8._0_8_;
  peVar1 = ((__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *)local_350._M_head_impl)->
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_350._M_head_impl = (uchar *)0x0;
    local_2b8 = 0;
  }
  else {
    local_350._M_head_impl =
         *(uchar **)
          &(peVar1->pixel)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
    local_2b8 = peVar1->xpadding + peVar1->width;
  }
  if (*(long *)(local_2c8._0_8_ + 8) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_268);
    uVar2 = ((local_2a8->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            timestamp;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"rc_visard_",10);
    auVar36._8_4_ = (int)(uVar2 >> 0x20);
    auVar36._0_8_ = uVar2;
    auVar36._12_4_ = 0x45300000;
    *(undefined8 *)(local_260 + *(long *)(local_268 + -0x18)) = 0x10;
    poVar4 = std::ostream::_M_insert<double>
                       (((auVar36._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                        1000000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".ply",4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)this,&local_2e8);
    puVar3 = (undefined1 *)
             CONCAT44(uStack_2e4,
                      CONCAT13(uStack_2e5,CONCAT12(bStack_2e6,CONCAT11(bStack_2e7,local_2e8))));
    if (puVar3 != local_2d8) {
      operator_delete(puVar3);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_268);
    std::ios_base::~ios_base(local_1f8);
  }
  std::ofstream::ofstream(&local_268,(string *)this,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"ply",3);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"format ascii 1.0",0x10);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"comment Created with gc_pointcloud from Roboception GmbH",0x38);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"comment Camera [1 0 0; 0 1 0; 0 0 1] [0 0 0]",0x2c);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"element vertex ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_268);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"property float32 x",0x12);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"property float32 y",0x12);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"property float32 z",0x12);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"property float32 scan_size",0x1a);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  if (local_348._M_head_impl != (uchar *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,"property float32 scan_conf",0x1a);
    std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
    std::ostream::put((char)&local_268);
    std::ostream::flush();
  }
  if (local_350._M_head_impl != (uchar *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_268,"property float32 scan_error",0x1b);
    std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
    std::ostream::put((char)&local_268);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"property uint8 diffuse_red",0x1a);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"property uint8 diffuse_green",0x1c);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"property uint8 diffuse_blue",0x1b);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"element face ",0xd);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&local_268,(int)local_358._M_head_impl);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_268,"property list uint8 uint32 vertex_indices",0x29);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"end_header",10);
  std::ios::widen((char)(ostream *)&local_268 + (char)*(undefined8 *)(local_268 + -0x18));
  std::ostream::put((char)&local_268);
  std::ostream::flush();
  if (local_340 != (uchar *)0x0) {
    auVar26._8_4_ = (int)(local_330 >> 0x20);
    auVar26._0_8_ = local_330;
    auVar26._12_4_ = 0x45300000;
    dVar25 = auVar26._8_8_ - 1.9342813113834067e+25;
    dVar44 = dVar25 + ((double)CONCAT44(0x43300000,(int)local_330) - 4503599627370496.0);
    local_2f0 = local_2f0 * dVar44;
    auVar27._0_8_ = (double)CONCAT44(0x43300000,(int)local_340);
    auVar27._8_4_ = (int)((ulong)local_340 >> 0x20);
    auVar27._12_4_ = 0x45300000;
    dStack_60 = auVar27._8_8_ - 1.9342813113834067e+25;
    local_288 = local_330 + (local_330 == 0);
    local_298 = local_2f0 * local_320;
    puVar14 = (uchar *)0x0;
    local_68 = (dStack_60 + (auVar27._0_8_ - 4503599627370496.0)) * -0.5;
    local_58._0_8_ = dVar44 * -0.5;
    local_58._8_8_ = dVar25;
    do {
      auVar28._8_4_ = (int)((ulong)puVar14 >> 0x20);
      auVar28._0_8_ = puVar14;
      auVar28._12_4_ = 0x45300000;
      dStack_40 = auVar28._8_8_ - 1.9342813113834067e+25;
      local_48 = (dStack_40 + ((double)CONCAT44(0x43300000,(uint32_t)puVar14) - 4503599627370496.0)
                  + 0.5 + local_68) * local_320;
      lVar9 = 0;
      lVar15 = 0;
      do {
        lVar6 = lVar9 + 1;
        lVar11 = lVar9;
        if (local_359 != '\0') {
          lVar6 = lVar9;
          lVar11 = lVar9 + 1;
        }
        puVar13 = (uchar *)((double)CONCAT11(*(uchar *)((long)local_318.
                                                                                                                            
                                                  super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl + lVar6),
                                             *(uchar *)((long)local_318.
                                                                                                                            
                                                  super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl + lVar11)) * (double)local_338);
        if (((double)puVar13 != 0.0) || (NAN((double)puVar13))) {
          auVar29._8_4_ = (int)((ulong)lVar15 >> 0x20);
          auVar29._0_8_ = lVar15;
          auVar29._12_4_ = 0x45300000;
          dStack_300 = auVar29._8_8_ - 1.9342813113834067e+25;
          dVar25 = dStack_300 + ((double)CONCAT44(0x43300000,(uint32_t)lVar15) - 4503599627370496.0)
          ;
          local_308 = (pointer)(((dVar25 + 0.5 + (double)local_58._0_8_) * local_320) /
                               (double)puVar13);
          local_2c8._8_8_ = local_58._8_8_ & 0x7fffffffffffffff;
          local_2c8._0_8_ =
               ABS((((double)local_58._0_8_ + dVar25) * local_320) / (double)puVar13 -
                   (double)local_308) * 2.8;
          local_358._M_head_impl = puVar13;
          getColor((uint8_t *)&local_2e8,local_2a8,(uint32_t)local_290,(uint32_t)lVar15,
                   (uint32_t)puVar14);
          poVar4 = std::ostream::_M_insert<double>((double)local_308);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>(local_48 / (double)local_358._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>(local_298 / (double)local_358._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>((double)local_2c8._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          if (local_348._M_head_impl != (uchar *)0x0) {
            poVar4 = std::ostream::_M_insert<double>((double)local_348._M_head_impl[lVar15] / 255.0)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          }
          if (local_350._M_head_impl != (uchar *)0x0) {
            poVar4 = std::ostream::_M_insert<double>
                               (((double)local_350._M_head_impl[lVar15] * (double)local_338 *
                                 local_2f0 * local_320) /
                                ((double)local_358._M_head_impl * (double)local_358._M_head_impl));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          }
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_268,(uint)(byte)local_2e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_268,(uint)bStack_2e7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          plVar5 = (long *)std::ostream::operator<<((ostream *)&local_268,(uint)bStack_2e6);
          std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
          std::ostream::put((char)plVar5);
          std::ostream::flush();
        }
        lVar15 = lVar15 + 1;
        lVar9 = lVar9 + 2;
      } while (local_288 != lVar15);
      local_318.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (_Head_base<0UL,_unsigned_char_*,_false>)
           ((long)local_318.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + local_328);
      local_348._M_head_impl = local_348._M_head_impl + local_2b0;
      local_350._M_head_impl = local_350._M_head_impl + local_2b8;
      puVar14 = puVar14 + 1;
    } while (puVar14 != local_340);
  }
  if ((uchar *)0x1 < local_340) {
    local_358._M_head_impl =
         *(uchar **)
          &(((local_2a0->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           pixel)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
           _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>;
    local_2c8._0_4_ = local_30c & 0xffff;
    local_320 = (double)(local_330 - 1);
    local_350._M_head_impl = (uchar *)(local_330 * 4);
    local_338 = local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_308 = local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + local_330 + 1;
    puVar14 = (uchar *)0x1;
    do {
      lVar9 = local_328;
      _Var23._M_head_impl = local_358._M_head_impl;
      local_348._M_head_impl = puVar14;
      if (1 < local_330) {
        lVar15 = 0;
        dVar25 = local_320;
        do {
          lVar22 = lVar15 + 2;
          bVar24 = local_359 != '\0';
          lVar6 = lVar15 + 1;
          lVar11 = lVar15;
          if (bVar24) {
            lVar6 = lVar15;
            lVar11 = lVar15 + 1;
          }
          lVar16 = lVar22;
          if (bVar24) {
            lVar16 = lVar15 + 3;
          }
          lVar10 = lVar15 + 3;
          if (bVar24) {
            lVar10 = lVar22;
          }
          sVar43 = CONCAT11(local_358._M_head_impl[lVar6],local_358._M_head_impl[lVar11]);
          sVar8 = CONCAT11(local_358._M_head_impl[lVar10],local_358._M_head_impl[lVar16]);
          sVar12 = CONCAT11(*(undefined1 *)((long)_Var23._M_head_impl + lVar6 + lVar9),
                            *(undefined1 *)((long)_Var23._M_head_impl + lVar11 + lVar9));
          iVar7 = (uint)*(byte *)((long)_Var23._M_head_impl + lVar10 + lVar9) << 8;
          uVar18 = (ushort)*(byte *)((long)_Var23._M_head_impl + lVar16 + lVar9) | (ushort)iVar7;
          uVar19 = CONCAT26(uVar18,CONCAT24(sVar12,CONCAT22(sVar8,sVar43)));
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar19;
          auVar37._0_2_ = -(ushort)(sVar43 == 0);
          auVar37._2_2_ = -(ushort)(sVar43 == 0);
          auVar37._4_2_ = -(ushort)(sVar8 == 0);
          auVar37._6_2_ = -(ushort)(sVar8 == 0);
          auVar37._8_2_ = -(ushort)(sVar12 == 0);
          auVar37._10_2_ = -(ushort)(sVar12 == 0);
          auVar37._12_2_ = -(ushort)(uVar18 == 0);
          auVar37._14_2_ = -(ushort)(uVar18 == 0);
          uVar21 = movmskps(iVar7,auVar37);
          if (2 < ((byte)(0x4332322132212110 >> ((byte)((uVar21 ^ 0xf) << 2) & 0x3f)) & 7)) {
            auVar38._0_2_ = -(ushort)(sVar43 == 0);
            auVar38._2_2_ = -(ushort)(sVar8 == 0);
            auVar38._4_2_ = -(ushort)(sVar12 == 0);
            auVar38._6_2_ = -(ushort)(uVar18 == 0);
            auVar38._8_2_ = 0xffff;
            auVar38._10_2_ = 0xffff;
            auVar38._12_2_ = 0xffff;
            auVar38._14_2_ = 0xffff;
            auVar38 = auVar38 | auVar30;
            uVar32 = auVar38._4_4_;
            auVar52._4_4_ = uVar32;
            auVar52._0_4_ = uVar32;
            auVar52._8_4_ = uVar32;
            auVar52._12_4_ = uVar32;
            auVar50 = psubusw(auVar38,auVar52);
            sVar42 = auVar38._0_2_ - auVar50._0_2_;
            uVar54 = auVar38._2_2_ - auVar50._2_2_;
            auVar33._0_8_ =
                 CONCAT26(auVar38._6_2_ - auVar50._6_2_,
                          CONCAT24(auVar38._4_2_ - auVar50._4_2_,CONCAT22(uVar54,sVar42)));
            auVar33._8_2_ = auVar38._8_2_ - auVar50._8_2_;
            auVar33._10_2_ = auVar38._10_2_ - auVar50._10_2_;
            auVar39._12_2_ = auVar38._12_2_ - auVar50._12_2_;
            auVar39._0_12_ = auVar33;
            auVar39._14_2_ = auVar38._14_2_ - auVar50._14_2_;
            auVar53._2_2_ = 0;
            auVar53._0_2_ = uVar54;
            auVar53._4_4_ = (uint)((ulong)auVar33._0_8_ >> 0x30);
            auVar53._8_4_ = auVar33._8_4_ >> 0x10;
            auVar53._12_4_ = auVar39._12_4_ >> 0x10;
            auVar57 = psubusw(auVar39,auVar53);
            uVar32 = (undefined4)(uVar19 >> 0x20);
            auVar40._4_4_ = uVar32;
            auVar40._0_4_ = uVar32;
            auVar40._8_4_ = uVar32;
            auVar40._12_4_ = uVar32;
            auVar50 = psubusw(auVar40,auVar30);
            sVar43 = auVar50._0_2_ + sVar43;
            uVar54 = auVar50._2_2_ + sVar8;
            auVar34._0_8_ =
                 CONCAT26(auVar50._6_2_ + uVar18,
                          CONCAT24(auVar50._4_2_ + sVar12,CONCAT22(uVar54,sVar43)));
            auVar34._8_2_ = auVar50._8_2_;
            auVar34._10_2_ = auVar50._10_2_;
            auVar41._12_2_ = auVar50._12_2_;
            auVar41._14_2_ = auVar50._14_2_;
            auVar41._0_12_ = auVar34;
            auVar31._2_2_ = 0;
            auVar31._0_2_ = uVar54;
            auVar31._4_4_ = (uint)((ulong)auVar34._0_8_ >> 0x30);
            auVar31._8_4_ = auVar34._8_4_ >> 0x10;
            auVar31._12_4_ = auVar41._12_4_ >> 0x10;
            auVar50 = psubusw(auVar31,auVar41);
            if ((int)((uint)(ushort)(auVar50._0_2_ + sVar43) -
                     (uint)(ushort)(sVar42 - auVar57._0_2_)) <= (int)local_2c8._0_4_) {
              iVar7 = *(int *)((long)local_338 + lVar15 * 2);
              bVar24 = iVar7 != -1;
              if (bVar24) {
                local_2e8 = SUB41(iVar7,0);
                bStack_2e7 = (byte)((uint)iVar7 >> 8);
                bStack_2e6 = (byte)((uint)iVar7 >> 0x10);
                uStack_2e5 = (undefined1)((uint)iVar7 >> 0x18);
              }
              iVar7 = *(int *)((long)local_308 + lVar15 * 2 + -4);
              uVar19 = (ulong)bVar24;
              if (iVar7 != -1) {
                uVar19 = (ulong)(bVar24 + 1);
                *(int *)(&local_2e8 + (ulong)bVar24 * 4) = iVar7;
              }
              iVar7 = *(int *)((long)local_308 + lVar15 * 2);
              uVar20 = uVar19;
              if (iVar7 != -1) {
                uVar20 = (ulong)((int)uVar19 + 1);
                *(int *)(&local_2e8 + uVar19 * 4) = iVar7;
              }
              iVar7 = *(int *)((long)local_338 + lVar15 * 2 + 4);
              uVar19 = uVar20;
              if (iVar7 != -1) {
                uVar19 = (ulong)((int)uVar20 + 1);
                *(int *)(&local_2e8 + uVar20 * 4) = iVar7;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"3 ",2);
              local_318.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (_Head_base<0UL,_unsigned_char_*,_false>)
                   (ulong)CONCAT13(uStack_2e5,CONCAT12(bStack_2e6,CONCAT11(bStack_2e7,local_2e8)));
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_268);
              local_35a = ' ';
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_35a,1);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              local_35a = ' ';
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_35a,1);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              if ((int)uVar19 == 4) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_268,"3 ",2);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_268);
                local_35a = ' ';
                poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_35a,1);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                local_35a = ' ';
                poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_35a,1);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
              }
            }
          }
          dVar25 = (double)((long)dVar25 + -1);
          lVar15 = lVar22;
        } while (dVar25 != 0.0);
      }
      local_358._M_head_impl = local_358._M_head_impl + local_328;
      puVar14 = local_348._M_head_impl + 1;
      local_338 = (pointer)((long)local_338 + (long)local_350._M_head_impl);
      local_308 = (pointer)((long)local_308 + (long)local_350._M_head_impl);
    } while (puVar14 != local_340);
  }
  std::ofstream::close();
  local_268 = _VTT;
  *(undefined8 *)(local_260 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_260);
  std::ios_base::~ios_base(local_170);
  if (local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void storePointCloud(std::string name, double f, double t, double scale,
                     std::shared_ptr<const Image> left,
                     std::shared_ptr<const Image> disp,
                     std::shared_ptr<const Image> conf,
                     std::shared_ptr<const Image> error)
{
  // get size and scale factor between left image and disparity image

  size_t width=disp->getWidth();
  size_t height=disp->getHeight();
  bool bigendian=disp->isBigEndian();
  size_t ds=(left->getWidth()+disp->getWidth()-1)/disp->getWidth();

  // convert focal length factor into focal length in (disparity) pixels

  f*=width;

  // get pointer to disparity data and size of row in bytes

  const uint8_t *dps=disp->getPixels();
  size_t dstep=disp->getWidth()*sizeof(uint16_t)+disp->getXPadding();

  // count number of valid disparities and store vertice index in a temporary
  // index image

  size_t vi=0;
  const uint32_t vinvalid=0xffffffff;
  std::vector<uint32_t> vindex(width*height);

  uint32_t n=0;
  for (size_t k=0; k<height; k++)
  {
    int j=0;
    for (size_t i=0; i<width; i++)
    {
      vindex[vi]=vinvalid;
      if ((dps[j]|dps[j+1]) != 0) vindex[vi]=n++;

      j+=2;
      vi++;
    }

    dps+=dstep;
  }

  dps=disp->getPixels();

  // count number of triangles

  const uint16_t vstep=static_cast<uint16_t>(std::ceil(2/scale));

  int tn=0;
  for (size_t k=1; k<height; k++)
  {
    for (size_t i=1; i<width; i++)
    {
      uint16_t v[4];
      v[0]=getUint16(dps, bigendian, i-1);
      v[1]=getUint16(dps, bigendian, i);
      v[2]=getUint16(dps+dstep, bigendian, i-1);
      v[3]=getUint16(dps+dstep, bigendian, i);

      uint16_t vmin=65535;
      uint16_t vmax=0;
      int valid=0;

      for (int jj=0; jj<4; jj++)
      {
        if (v[jj])
        {
          vmin=std::min(vmin, v[jj]);
          vmax=std::max(vmax, v[jj]);
          valid++;
        }
      }

      if (valid >= 3 && vmax-vmin <= vstep)
      {
        tn+=valid-2;
      }
    }

    dps+=dstep;
  }

  dps=disp->getPixels();

  // get pointer to optional confidence and error data and size of row in bytes

  const uint8_t *cps=0, *eps=0;
  size_t cstep=0, estep=0;

  if (conf)
  {
    cps=conf->getPixels();
    cstep=conf->getWidth()*sizeof(uint8_t)+conf->getXPadding();
  }

  if (error)
  {
    eps=error->getPixels();
    estep=error->getWidth()*sizeof(uint8_t)+error->getXPadding();
  }

  // open output file and write ASCII PLY header

  if (name.size() == 0)
  {
    std::ostringstream os;
    double timestamp=left->getTimestampNS()/1000000000.0;
    os << "rc_visard_" << std::setprecision(16) << timestamp << ".ply";
    name=os.str();
  }

  std::ofstream out(name);

  out << "ply" << std::endl;
  out << "format ascii 1.0" << std::endl;
  out << "comment Created with gc_pointcloud from Roboception GmbH" << std::endl;
  out << "comment Camera [1 0 0; 0 1 0; 0 0 1] [0 0 0]" << std::endl;
  out << "element vertex " << n << std::endl;
  out << "property float32 x" << std::endl;
  out << "property float32 y" << std::endl;
  out << "property float32 z" << std::endl;
  out << "property float32 scan_size" << std::endl; // i.e. size of 3D point

  if (cps != 0)
  {
    out << "property float32 scan_conf" << std::endl; // optional confidence
  }

  if (eps != 0)
  {
    out << "property float32 scan_error" << std::endl; // optional error in 3D along line of sight
  }

  out << "property uint8 diffuse_red" << std::endl;
  out << "property uint8 diffuse_green" << std::endl;
  out << "property uint8 diffuse_blue" << std::endl;
  out << "element face " << tn << std::endl;
  out << "property list uint8 uint32 vertex_indices" << std::endl;
  out << "end_header" << std::endl;

  // create colored point cloud

  for (size_t k=0; k<height; k++)
  {
    for (size_t i=0; i<width; i++)
    {
      // convert disparity from fixed comma 16 bit integer into float value

      double d=scale*getUint16(dps, bigendian, i);

      // if disparity is valid and color can be obtained

      if (d)
      {
        // reconstruct 3D point from disparity value

        double x=(i+0.5-0.5*width)*t/d;
        double y=(k+0.5-0.5*height)*t/d;
        double z=f*t/d;

        // compute size of reconstructed point

        double x2=(i-0.5*width)*t/d;
        double size=2*1.4*std::abs(x2-x);

        // get corresponding color value

        uint8_t rgb[3];
        getColor(rgb, left, static_cast<uint32_t>(ds), static_cast<uint32_t>(i),
                 static_cast<uint32_t>(k));

        // store colored point, optionally with confidence and error

        out << x << " " << y << " " << z << " " << size << " ";

        if (cps != 0)
        {
          out << cps[i]/255.0 << " ";
        }

        if (eps != 0)
        {
          out << eps[i]*scale*f*t/(d*d) << " ";
        }

        out << static_cast<int>(rgb[0]) << " ";
        out << static_cast<int>(rgb[1]) << " ";
        out << static_cast<int>(rgb[2]) << std::endl;
      }
    }

    dps+=dstep;
    cps+=cstep;
    eps+=estep;
  }

  dps=disp->getPixels();

  // create triangles

  uint32_t *ips=vindex.data();
  for (size_t k=1; k<height; k++)
  {
    for (size_t i=1; i<width; i++)
    {
      uint16_t v[4];
      v[0]=getUint16(dps, bigendian, i-1);
      v[1]=getUint16(dps, bigendian, i);
      v[2]=getUint16(dps+dstep, bigendian, i-1);
      v[3]=getUint16(dps+dstep, bigendian, i);

      uint16_t vmin=65535;
      uint16_t vmax=0;
      int valid=0;

      for (int jj=0; jj<4; jj++)
      {
        if (v[jj])
        {
          vmin=std::min(vmin, v[jj]);
          vmax=std::max(vmax, v[jj]);
          valid++;
        }
      }

      if (valid >= 3 && vmax-vmin <= vstep)
      {
        int j=0;
        uint32_t fc[4];

        if (ips[i-1] != vinvalid)
        {
          fc[j++]=ips[i-1];
        }

        if (ips[width+i-1] != vinvalid)
        {
          fc[j++]=ips[width+i-1];
        }

        if (ips[width+i] != vinvalid)
        {
          fc[j++]=ips[width+i];
        }

        if (ips[i] != vinvalid)
        {
          fc[j++]=ips[i];
        }

        out << "3 " << fc[0] << ' ' << fc[1] << ' ' << fc[2] << std::endl;

        if (j == 4)
        {
          out << "3 " << fc[2] << ' ' << fc[3] << ' ' << fc[0] << std::endl;
        }
      }
    }

    ips+=width;
    dps+=dstep;
  }

  out.close();
}